

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskq.c
# Opt level: O0

void nni_taskq_thread(void *self)

{
  nni_list *list;
  void *item;
  nni_task *task;
  nni_taskq *tq;
  nni_taskq_thr *thr;
  void *self_local;
  
  list = *self;
  nni_thr_set_name((nni_thr *)0x0,"nng:task");
  nni_mtx_lock((nni_mtx *)(list + 1));
  while( true ) {
    while( true ) {
      item = nni_list_first(list);
      if (item == (void *)0x0) break;
      nni_list_remove(list,item);
      nni_mtx_unlock((nni_mtx *)(list + 1));
      (**(code **)((long)item + 0x18))(*(undefined8 *)((long)item + 0x10));
      nni_mtx_lock((nni_mtx *)((long)item + 0x30));
      *(int *)((long)item + 0x28) = *(int *)((long)item + 0x28) + -1;
      if (*(int *)((long)item + 0x28) == 0) {
        nni_cv_wake((nni_cv *)((long)item + 0x58));
      }
      nni_mtx_unlock((nni_mtx *)((long)item + 0x30));
      nni_mtx_lock((nni_mtx *)(list + 1));
    }
    nni_cv_wake((nni_cv *)(list + 5));
    if ((list[7].ll_offset & 0x100000000) == 0) break;
    nni_cv_wait((nni_cv *)&list[2].ll_offset);
  }
  nni_mtx_unlock((nni_mtx *)(list + 1));
  return;
}

Assistant:

static void
nni_taskq_thread(void *self)
{
	nni_taskq_thr *thr = self;
	nni_taskq     *tq  = thr->tqt_tq;
	nni_task      *task;

	nni_thr_set_name(NULL, "nng:task");

	nni_mtx_lock(&tq->tq_mtx);
	for (;;) {
		if ((task = nni_list_first(&tq->tq_tasks)) != NULL) {

			nni_list_remove(&tq->tq_tasks, task);

			nni_mtx_unlock(&tq->tq_mtx);

			task->task_cb(task->task_arg);

			nni_mtx_lock(&task->task_mtx);
			task->task_busy--;
			if (task->task_busy == 0) {
				nni_cv_wake(&task->task_cv);
			}
			nni_mtx_unlock(&task->task_mtx);

			nni_mtx_lock(&tq->tq_mtx);

			continue;
		}

		nni_cv_wake(&tq->tq_wait_cv);
		if (!tq->tq_run) {
			break;
		}
		nni_cv_wait(&tq->tq_sched_cv);
	}
	nni_mtx_unlock(&tq->tq_mtx);
}